

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O1

void CreateBinaryTree(void)

{
  size_t __nmemb;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  vocab_word *pvVar1;
  FILE *__stream;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  longlong lVar7;
  long lVar8;
  bool bVar9;
  char code [40];
  longlong point [40];
  int8_t local_1a8 [48];
  long local_178 [41];
  
  lVar7 = vocab_size;
  lVar3 = vocab_size * 2;
  __nmemb = vocab_size * 2 + 1;
  __ptr = calloc(__nmemb,8);
  __ptr_00 = calloc(__nmemb,8);
  __ptr_01 = calloc(__nmemb,8);
  if (0 < lVar7) {
    lVar2 = 0;
    pvVar1 = vocab;
    do {
      *(longint *)((long)__ptr + lVar2 * 8) = pvVar1->cn;
      lVar2 = lVar2 + 1;
      pvVar1 = pvVar1 + 1;
    } while (lVar7 != lVar2);
  }
  if (SBORROW8(lVar7,lVar3) != 0 < lVar7) {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)__ptr + lVar3 * 8 + lVar7 * 8) = 1000000000000000;
      lVar3 = lVar3 + 1;
    } while (lVar7 != lVar3);
  }
  if (1 < lVar7) {
    lVar3 = lVar7 + -1;
    lVar5 = 0;
    lVar2 = lVar7;
    do {
      if ((lVar3 < 0) || (*(long *)((long)__ptr + lVar2 * 8) <= *(long *)((long)__ptr + lVar3 * 8)))
      {
        lVar8 = lVar2 + 1;
        lVar4 = lVar2;
        lVar6 = lVar3;
      }
      else {
        lVar4 = lVar3;
        lVar6 = lVar3 + -1;
        lVar8 = lVar2;
      }
      if ((lVar6 < 0) || (*(long *)((long)__ptr + lVar8 * 8) <= *(long *)((long)__ptr + lVar6 * 8)))
      {
        lVar2 = lVar8 + 1;
        lVar3 = lVar6;
      }
      else {
        lVar3 = lVar6 + -1;
        lVar2 = lVar8;
        lVar8 = lVar6;
      }
      *(long *)((long)__ptr + lVar5 * 8 + lVar7 * 8) =
           *(long *)((long)__ptr + lVar8 * 8) + *(long *)((long)__ptr + lVar4 * 8);
      *(longlong *)((long)__ptr_01 + lVar4 * 8) = lVar7 + lVar5;
      *(longlong *)((long)__ptr_01 + lVar8 * 8) = lVar7 + lVar5;
      *(undefined8 *)((long)__ptr_00 + lVar8 * 8) = 1;
      lVar5 = lVar5 + 1;
    } while (lVar7 + -1 != lVar5);
  }
  __stream = fopen(output_classifier,"wb");
  if (1 < vocab_size) {
    lVar3 = 0;
    do {
      if (binary == 0) {
        fprintf(__stream,"%lld %lld %lld\n",lVar3,*(undefined8 *)((long)__ptr_01 + lVar3 * 8));
      }
      else {
        local_178[0] = (*(long *)((long)__ptr_00 + lVar3 * 8) * 2 + -1) *
                       *(long *)((long)__ptr_01 + lVar3 * 8);
        fwrite(local_178,8,1,__stream);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < vocab_size * 2 + -2);
  }
  fclose(__stream);
  if (0 < vocab_size) {
    lVar3 = 0;
    lVar7 = vocab_size;
    do {
      pvVar1 = vocab;
      lVar5 = 0;
      lVar2 = lVar3;
      lVar8 = 1;
      do {
        lVar6 = lVar8;
        lVar4 = lVar5;
        local_1a8[lVar4] = *(int8_t *)((long)__ptr_00 + lVar2 * 8);
        local_178[lVar4] = lVar2;
        lVar2 = *(long *)((long)__ptr_01 + lVar2 * 8);
        lVar5 = lVar4 + 1;
        lVar8 = lVar6 + 1;
      } while (lVar2 != lVar7 * 2 + -2);
      vocab_size = lVar7;
      vocab[lVar3].codelen = (int8_t)(lVar4 + 1);
      *pvVar1[lVar3].point = (int)lVar7 + -2;
      lVar2 = 0;
      do {
        vocab[lVar3].code[lVar6 + -1] = local_1a8[lVar2];
        vocab[lVar3].point[lVar6] = (int)local_178[lVar2] - (int)vocab_size;
        lVar2 = lVar2 + 1;
        lVar6 = lVar6 + -1;
        bVar9 = lVar4 != 0;
        lVar4 = lVar4 + -1;
      } while (bVar9);
      lVar3 = lVar3 + 1;
      lVar7 = vocab_size;
    } while (lVar3 < vocab_size);
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return;
}

Assistant:

void CreateBinaryTree() {
  long long a, b, i, min1i, min2i, pos1, pos2, point[MAX_CODE_LENGTH];
  char code[MAX_CODE_LENGTH];
  long long *count = (long long *)calloc(vocab_size * 2 + 1, sizeof(long long));
  long long *binary_side = (long long *)calloc(vocab_size * 2 + 1, sizeof(long long));
  long long *parent_node = (long long *)calloc(vocab_size * 2 + 1, sizeof(long long));
  for (a = 0; a < vocab_size; a++) count[a] = vocab[a].cn;
  for (a = vocab_size; a < vocab_size * 2; a++) count[a] = 1e15;
  pos1 = vocab_size - 1;
  pos2 = vocab_size;
  // Following algorithm constructs the Huffman tree by adding one node at a time
  for (a = 0; a < vocab_size - 1; a++) {
    // First, find two smallest nodes 'min1, min2'
    if (pos1 >= 0) {
      if (count[pos1] < count[pos2]) {
        min1i = pos1;
        pos1--;
      } else {
        min1i = pos2;
        pos2++;
      }
    } else {
      min1i = pos2;
      pos2++;
    }
    if (pos1 >= 0) {
      if (count[pos1] < count[pos2]) {
        min2i = pos1;
        pos1--;
      } else {
        min2i = pos2;
        pos2++;
      }
    } else {
      min2i = pos2;
      pos2++;
    }
    count[vocab_size + a] = count[min1i] + count[min2i];
    parent_node[min1i] = vocab_size + a;
    parent_node[min2i] = vocab_size + a;
    binary_side[min2i] = 1;
  }
  // Outputs the tree if requested
  if (output_classifier) {
    FILE * file = fopen(output_classifier, "wb");
    // The root is not written (node vocab_size * 2 - 2)
    for (b = 0; b < vocab_size * 2 - 2; b++) {
      if (binary) {
        // In binary mode, just write the parent * sign
        // where sign is +1 or -1, depending on which child is used
        longint d = (2 * binary_side[b] - 1) * parent_node[b];
        fwrite(&d, sizeof(longint), 1,  file);
      } else fprintf(file, "%lld %lld %lld\n", b, parent_node[b], binary_side[b]);
    }
    fclose(file);
  }

  // Now assign binary_side code to each vocabulary word
  for (a = 0; a < vocab_size; a++) {
    b = a;
    i = 0;
    while (1) {
      code[i] = binary_side[b];
      point[i] = b;
      i++;
      b = parent_node[b];
      if (b == vocab_size * 2 - 2) break;
    }
    vocab[a].codelen = i;
    vocab[a].point[0] = vocab_size - 2;
    for (b = 0; b < i; b++) {
      vocab[a].code[i - b - 1] = code[b];
      vocab[a].point[i - b] = point[b] - vocab_size;
    }
  }
  free(count);
  free(binary_side);
  free(parent_node);
}